

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1cmap.c
# Opt level: O0

FT_UInt32 t1_cmap_std_char_next(T1_CMapStd cmap,FT_UInt32 *pchar_code)

{
  FT_UInt32 local_20;
  FT_UInt local_1c;
  FT_UInt32 char_code;
  FT_UInt result;
  FT_UInt32 *pchar_code_local;
  T1_CMapStd cmap_local;
  
  local_1c = 0;
  local_20 = *pchar_code;
  do {
    local_20 = local_20 + 1;
    if (0xff < local_20) {
      local_20 = 0;
      break;
    }
    local_1c = t1_cmap_std_char_index(cmap,local_20);
  } while (local_1c == 0);
  *pchar_code = local_20;
  return local_1c;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 )
  t1_cmap_std_char_next( T1_CMapStd   cmap,
                         FT_UInt32   *pchar_code )
  {
    FT_UInt    result    = 0;
    FT_UInt32  char_code = *pchar_code + 1;


    while ( char_code < 256 )
    {
      result = t1_cmap_std_char_index( cmap, char_code );
      if ( result != 0 )
        goto Exit;

      char_code++;
    }
    char_code = 0;

  Exit:
    *pchar_code = char_code;
    return result;
  }